

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O1

void __thiscall
spirv_cross::Parser::Parser(Parser *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv)

{
  ParsedIR::ParsedIR(&this->ir);
  (this->global_struct_cache).super_VectorView<unsigned_int>.ptr = (uint *)0x0;
  (this->global_struct_cache).super_VectorView<unsigned_int>.buffer_size = 0;
  this->current_function = (SPIRFunction *)0x0;
  this->current_block = (SPIRBlock *)0x0;
  this->ignore_trailing_block_opcodes = false;
  (this->global_struct_cache).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->global_struct_cache).stack_storage;
  (this->global_struct_cache).buffer_capacity = 8;
  (this->forward_pointer_fixups).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr =
       (pair<unsigned_int,_unsigned_int> *)0x0;
  (this->forward_pointer_fixups).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.
  buffer_size = 0;
  (this->forward_pointer_fixups).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr =
       (pair<unsigned_int,_unsigned_int> *)&(this->forward_pointer_fixups).stack_storage;
  (this->forward_pointer_fixups).buffer_capacity = 8;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&(this->ir).spirv,spirv);
  return;
}

Assistant:

Parser::Parser(vector<uint32_t> spirv)
{
	ir.spirv = std::move(spirv);
}